

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O3

ostream * std::operator<<(ostream *os,
                         vector<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_> *v)

{
  ulong uVar1;
  ulong uVar2;
  pointer pPVar3;
  long lVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  pPVar3 = (v->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((v->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>)._M_impl.
      super__Vector_impl_data._M_finish != pPVar3) {
    lVar4 = 0;
    uVar2 = 0;
    do {
      operator<<(os,(Payload *)((long)&(pPVar3->asset_path).asset_path_._M_dataplus._M_p + lVar4));
      pPVar3 = (v->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar1 = ((long)(v->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 5) *
              -0x71c71c71c71c71c7;
      if (uVar2 != uVar1 - 1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        pPVar3 = (v->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar1 = ((long)(v->super__Vector_base<tinyusdz::Payload,_std::allocator<tinyusdz::Payload>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3 >> 5) *
                -0x71c71c71c71c71c7;
      }
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + 0x120;
    } while (uVar2 < uVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}